

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlNodePtr
xmlCtxtParseContent(xmlParserCtxtPtr ctxt,xmlParserInputPtr input,xmlNodePtr node,int hasTextDecl)

{
  xmlElementType xVar1;
  uint uVar2;
  _xmlDoc *p_Var3;
  xmlDictPtr pxVar4;
  uint uVar5;
  int iVar6;
  xmlNodePtr pxVar7;
  xmlNs *saxData;
  int nr;
  xmlHashedString xVar8;
  xmlNodePtr local_88;
  xmlHashedString local_68;
  xmlHashedString local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((((input == (xmlParserInputPtr)0x0 || ctxt == (xmlParserCtxtPtr)0x0) ||
        node == (xmlNodePtr)0x0) || (p_Var3 = node->doc, p_Var3 == (_xmlDoc *)0x0)) ||
     (xVar1 = node->type, XML_HTML_DOCUMENT_NODE < xVar1)) {
LAB_0013a9d7:
    pxVar7 = (xmlNodePtr)0x0;
    xmlFatalErr(ctxt,XML_ERR_ARGUMENT,(char *)0x0);
  }
  else {
    if ((0x1bcU >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      local_88 = node;
      if ((0x2202U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) goto LAB_0013a9d7;
    }
    else {
      pxVar7 = node->parent;
      local_88 = node;
      if ((pxVar7 != (xmlNodePtr)0x0) &&
         ((XML_HTML_DOCUMENT_NODE < pxVar7->type ||
          (local_88 = pxVar7,
          (0x2202U >> (pxVar7->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)))) {
        do {
        } while( true );
      }
    }
    if (ctxt->html == 0) {
      xmlCtxtReset(ctxt);
    }
    else {
      htmlCtxtReset(ctxt);
    }
    pxVar4 = ctxt->dict;
    local_48._0_4_ = ctxt->options;
    local_48._4_4_ = ctxt->dictNames;
    uVar2 = ctxt->loadsubset;
    if (p_Var3->dict == (_xmlDict *)0x0) {
      uVar5 = (undefined4)local_48 | 0x1000;
      ctxt->options = uVar5;
      ctxt->dictNames = 0;
    }
    else {
      ctxt->dict = p_Var3->dict;
      uVar5 = (undefined4)local_48;
    }
    uStack_40 = 0;
    ctxt->loadsubset = uVar2 | 8;
    ctxt->myDoc = p_Var3;
    if (ctxt->html == 0) {
      xmlCtxtInitializeLate(ctxt);
      nr = 0;
      for (; (local_88 != (xmlNodePtr)0x0 && (local_88->type == XML_ELEMENT_NODE));
          local_88 = local_88->parent) {
        for (saxData = local_88->nsDef; saxData != (xmlNs *)0x0; saxData = saxData->next) {
          xVar8 = xmlDictLookupHashed(ctxt->dict,saxData->prefix,-1);
          local_58.name = xVar8.name;
          local_58.hashValue = xVar8.hashValue;
          xVar8 = xmlDictLookupHashed(ctxt->dict,saxData->href,-1);
          local_68.name = xVar8.name;
          local_68.hashValue = xVar8.hashValue;
          iVar6 = xmlParserNsPush(ctxt,&local_58,&local_68,saxData,1);
          nr = nr + (uint)(0 < iVar6);
        }
      }
      pxVar7 = xmlCtxtParseContentInternal(ctxt,input,hasTextDecl,1);
      if (0 < nr) {
        xmlParserNsPop(ctxt,nr);
      }
    }
    else {
      ctxt->options = uVar5 | 0x2000;
      pxVar7 = htmlCtxtParseContentInternal(ctxt,input);
    }
    ctxt->dict = pxVar4;
    ctxt->options = (undefined4)local_48;
    ctxt->dictNames = local_48._4_4_;
    ctxt->loadsubset = uVar2;
    ctxt->myDoc = (xmlDocPtr)0x0;
    ctxt->node = (xmlNodePtr)0x0;
  }
  xmlFreeInputStream(input);
  return pxVar7;
}

Assistant:

xmlNodePtr
xmlCtxtParseContent(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                    xmlNodePtr node, int hasTextDecl) {
    xmlDocPtr doc;
    xmlNodePtr cur, list = NULL;
    int nsnr = 0;
    xmlDictPtr oldDict;
    int oldOptions, oldDictNames, oldLoadSubset;

    if ((ctxt == NULL) || (input == NULL) || (node == NULL)) {
        xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
        goto exit;
    }

    doc = node->doc;
    if (doc == NULL) {
        xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
        goto exit;
    }

    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            break;

        case XML_ATTRIBUTE_NODE:
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
            for (cur = node->parent; cur != NULL; cur = node->parent) {
                if ((cur->type == XML_ELEMENT_NODE) ||
                    (cur->type == XML_DOCUMENT_NODE) ||
                    (cur->type == XML_HTML_DOCUMENT_NODE)) {
                    node = cur;
                    break;
                }
            }
            break;

        default:
            xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
            goto exit;
    }

#ifdef LIBXML_HTML_ENABLED
    if (ctxt->html)
        htmlCtxtReset(ctxt);
    else
#endif
        xmlCtxtReset(ctxt);

    oldDict = ctxt->dict;
    oldOptions = ctxt->options;
    oldDictNames = ctxt->dictNames;
    oldLoadSubset = ctxt->loadsubset;

    /*
     * Use input doc's dict if present, else assure XML_PARSE_NODICT is set.
     */
    if (doc->dict != NULL) {
        ctxt->dict = doc->dict;
    } else {
        ctxt->options |= XML_PARSE_NODICT;
        ctxt->dictNames = 0;
    }

    /*
     * Disable IDs
     */
    ctxt->loadsubset |= XML_SKIP_IDS;

    ctxt->myDoc = doc;

#ifdef LIBXML_HTML_ENABLED
    if (ctxt->html) {
        /*
         * When parsing in context, it makes no sense to add implied
         * elements like html/body/etc...
         */
        ctxt->options |= HTML_PARSE_NOIMPLIED;

        list = htmlCtxtParseContentInternal(ctxt, input);
    } else
#endif
    {
        xmlCtxtInitializeLate(ctxt);

        /*
         * initialize the SAX2 namespaces stack
         */
        cur = node;
        while ((cur != NULL) && (cur->type == XML_ELEMENT_NODE)) {
            xmlNsPtr ns = cur->nsDef;
            xmlHashedString hprefix, huri;

            while (ns != NULL) {
                hprefix = xmlDictLookupHashed(ctxt->dict, ns->prefix, -1);
                huri = xmlDictLookupHashed(ctxt->dict, ns->href, -1);
                if (xmlParserNsPush(ctxt, &hprefix, &huri, ns, 1) > 0)
                    nsnr++;
                ns = ns->next;
            }
            cur = cur->parent;
        }

        list = xmlCtxtParseContentInternal(ctxt, input, hasTextDecl, 1);

        if (nsnr > 0)
            xmlParserNsPop(ctxt, nsnr);
    }

    ctxt->dict = oldDict;
    ctxt->options = oldOptions;
    ctxt->dictNames = oldDictNames;
    ctxt->loadsubset = oldLoadSubset;
    ctxt->myDoc = NULL;
    ctxt->node = NULL;

exit:
    xmlFreeInputStream(input);
    return(list);
}